

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

Expression * __thiscall
wasm::SafeHeap::makeAlignCheck
          (SafeHeap *this,Address align,Builder *builder,Index local,Module *module,Name memoryName)

{
  Name target;
  Unary *left;
  bool bVar1;
  Memory *this_00;
  address64_t aVar2;
  Const *right;
  Binary *condition;
  Call *ifTrue;
  If *pIVar3;
  optional<wasm::Type> type;
  undefined1 local_c0 [2] [12];
  Type local_a0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  size_t local_78;
  char *pcStack_70;
  uintptr_t local_60;
  Unary *local_58;
  Expression *ptrBits;
  Type addressType;
  Memory *memory;
  Module *module_local;
  Index local_local;
  Builder *builder_local;
  SafeHeap *this_local;
  Address align_local;
  
  addressType.id = memoryName.super_IString.str._M_len;
  this_local = (SafeHeap *)align.addr;
  this_00 = Module::getMemory(module,memoryName);
  local_60 = (this_00->addressType).id;
  ptrBits = (Expression *)local_60;
  local_58 = (Unary *)Builder::makeLocalGet(builder,local,(Type)local_60);
  bVar1 = Memory::is64(this_00);
  if (bVar1) {
    local_58 = Builder::makeUnary(builder,WrapInt64,(Expression *)local_58);
  }
  left = local_58;
  aVar2 = wasm::Address::operator_cast_to_unsigned_long((Address *)&this_local);
  right = Builder::makeConst<int>(builder,(int)aVar2 + -1);
  condition = Builder::makeBinary(builder,AndInt32,(Expression *)left,(Expression *)right);
  local_78 = (this->alignfault).super_IString.str._M_len;
  pcStack_70 = (this->alignfault).super_IString.str._M_str;
  local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_98);
  wasm::Type::Type(&local_a0,none);
  target.super_IString.str._M_str = pcStack_70;
  target.super_IString.str._M_len = local_78;
  ifTrue = Builder::makeCall(builder,target,&local_98,local_a0,false);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_c0);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)local_c0[0]._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_c0[0][8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_c0[0]._9_3_;
  pIVar3 = Builder::makeIf(builder,(Expression *)condition,(Expression *)ifTrue,(Expression *)0x0,
                           type);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_98);
  return (Expression *)pIVar3;
}

Assistant:

Expression* makeAlignCheck(Address align,
                             Builder& builder,
                             Index local,
                             Module* module,
                             Name memoryName) {
    auto memory = module->getMemory(memoryName);
    auto addressType = memory->addressType;
    Expression* ptrBits = builder.makeLocalGet(local, addressType);
    if (memory->is64()) {
      ptrBits = builder.makeUnary(WrapInt64, ptrBits);
    }
    return builder.makeIf(
      builder.makeBinary(
        AndInt32, ptrBits, builder.makeConst(int32_t(align - 1))),
      builder.makeCall(alignfault, {}, Type::none));
  }